

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

void predict(ect *e,single_learner *base,example *ec)

{
  float fVar1;
  uint uVar2;
  uint32_t uVar3;
  ostream *poVar4;
  
  uVar2 = (ec->l).multi.label;
  fVar1 = (ec->l).simple.weight;
  if (((ulong)uVar2 == 0) || ((uVar2 != 0xffffffff && (e->k < (ulong)uVar2)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is not in {1,",0xe);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  uVar3 = ect_predict(e,base,ec);
  (ec->pred).multiclass = uVar3;
  (ec->l).multi.label = uVar2;
  (ec->l).simple.weight = fVar1;
  return;
}

Assistant:

void predict(ect& e, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;
  if (mc.label == 0 || (mc.label > e.k && mc.label != (uint32_t)-1))
    cout << "label " << mc.label << " is not in {1," << e.k << "} This won't work right." << endl;
  ec.pred.multiclass = ect_predict(e, base, ec);
  ec.l.multi = mc;
}